

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

QStringList * __thiscall
Parser::findEnumValues
          (QStringList *__return_storage_ptr__,Parser *this,QString *name,QStringList *includes)

{
  QString *pQVar1;
  QArrayData *data;
  char16_t *pcVar2;
  storage_type_conflict *psVar3;
  storage_type_conflict *psVar4;
  bool bVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  Data *pDVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  iterator iVar15;
  QString *pQVar16;
  qsizetype qVar17;
  pointer pQVar18;
  qsizetype qVar19;
  int __oflag;
  long lVar20;
  QString *e;
  QString *name_00;
  int iVar21;
  long lVar22;
  long in_FS_OFFSET;
  QStringView lhs;
  QStringView lhs_00;
  QStringView lhs_01;
  QStringView rhs;
  QStringView rhs_00;
  QStringView rhs_01;
  QStringList *ret;
  QRegularExpressionMatchIterator m;
  QRegularExpression macro;
  QRegularExpressionMatch match_1;
  QRegularExpressionMatchIterator m_1;
  QRegularExpressionMatch match;
  QTextStream stream;
  qsizetype offset;
  qsizetype local_170;
  QString local_128;
  QArrayDataPointer<QString> local_108;
  QRegularExpressionMatch local_e8;
  QRegularExpression local_e0;
  undefined1 local_d8 [24];
  QString *pQStack_c0;
  char16_t *local_b8;
  QIODevice local_a8;
  QArrayDataPointer<QString> local_98;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = L"::";
  local_78.d.size = 2;
  QString::split((QStringList *)&local_98,name,&local_78,(SplitBehavior)0x0,CaseSensitive);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  iVar15 = QList<QString>::end((QList<QString> *)&local_98);
  data = &(iVar15.i[-1].d.d)->super_QArrayData;
  pcVar2 = iVar15.i[-1].d.ptr;
  psVar3 = (storage_type_conflict *)iVar15.i[-1].d.size;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar22 = (includes->d).size;
  if (lVar22 != 0) {
    name_00 = (includes->d).ptr;
    pQVar1 = name_00 + lVar22;
    bVar12 = false;
    do {
      local_a8._vptr_QIODevice = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.d_ptr._M_t.
      super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
      super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
      super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
           (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>)
           &DAT_aaaaaaaaaaaaaaaa;
      QFile::QFile((QFile *)&local_a8,name_00);
      iVar13 = QFile::open((QFile *)&local_a8,(char *)0x11,__oflag);
      bVar9 = true;
      iVar21 = 1;
      if ((char)iVar13 != '\0') {
        local_d8._16_8_ = (QArrayData *)0x0;
        pQStack_c0 = (QString *)0x0;
        local_b8 = (char16_t *)0x0;
        local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QTextStream::QTextStream((QTextStream *)(local_d8 + 8),&local_a8);
        bVar9 = QTextStream::atEnd((QTextStream *)(local_d8 + 8));
        while (!bVar9) {
          local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QTextStream::readLine(&local_58,(QTextStream *)(local_d8 + 8),0);
          QString::trimmed_helper(&local_78,&local_58);
          pDVar6 = local_58.d.d;
          if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
            }
          }
          local_58.d.ptr = (char16_t *)CONCAT71(local_58.d.ptr._1_7_,10);
          local_58.d.d = (Data *)&local_78;
          operator+=((QString *)(local_d8 + 0x10),
                     (QStringBuilder<QString_&,_QLatin1Char> *)&local_58);
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
            }
          }
          bVar9 = QTextStream::atEnd((QTextStream *)(local_d8 + 8));
        }
        local_78.d.d = (Data *)0x0;
        local_78.d.ptr = L"//";
        local_78.d.size = 2;
        pQVar16 = (QString *)
                  QString::indexOf((QString *)(local_d8 + 0x10),&local_78,0,CaseSensitive);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        while (local_58.d.d = (Data *)pQVar16, -1 < (long)pQVar16) {
          local_78.d.d = (Data *)pQStack_c0;
          local_78.d.ptr = local_b8;
          QStringView::indexOf((QStringView *)&local_78,(QChar)0xa,(qsizetype)pQVar16,CaseSensitive)
          ;
          QString::remove((QString *)(local_d8 + 0x10),(char *)pQVar16);
          local_78.d.d = (Data *)0x0;
          local_78.d.ptr = L"//";
          local_78.d.size = 2;
          local_58.d.d = (Data *)QString::indexOf((QString *)(local_d8 + 0x10),&local_78,
                                                  (qsizetype)pQVar16,CaseSensitive);
          pQVar16 = (QString *)local_58.d.d;
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
              pQVar16 = (QString *)local_58.d.d;
            }
          }
        }
        local_78.d.d = (Data *)0x0;
        local_78.d.ptr = L"/*";
        local_78.d.size = 2;
        local_58.d.d = (Data *)QString::indexOf((QString *)(local_d8 + 0x10),&local_78,0,
                                                CaseSensitive);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        do {
          if ((long)local_58.d.d < 0) break;
          local_78.d.d = (Data *)0x0;
          local_78.d.ptr = L"*/";
          local_78.d.size = 2;
          qVar17 = QString::indexOf((QString *)(local_d8 + 0x10),&local_78,(qsizetype)local_58.d.d,
                                    CaseSensitive);
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
            }
          }
          pDVar6 = local_58.d.d;
          if (qVar17 != -1) {
            QString::remove((QString *)(local_d8 + 0x10),(char *)local_58.d.d);
            local_78.d.d = (Data *)0x0;
            local_78.d.ptr = L"/*";
            local_78.d.size = 2;
            local_58.d.d = (Data *)QString::indexOf((QString *)(local_d8 + 0x10),&local_78,
                                                    (qsizetype)pDVar6,CaseSensitive);
            if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
        } while (qVar17 != -1);
        local_58.d.d = (Data *)0x0;
        local_78.d.d = (Data *)0x0;
        while (bVar9 = findSpaceRange((QString *)(local_d8 + 0x10),(qsizetype *)&local_58,
                                      (qsizetype *)&local_78), bVar9) {
          QString::remove((QString *)(local_d8 + 0x10),(char *)local_58.d.d);
        }
        if ((ulong)local_98.size < (undefined1 *)0x2) {
          bVar9 = true;
          lVar22 = 0;
        }
        else {
          bVar9 = true;
          lVar22 = 0;
          local_170 = 0;
          do {
            local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_78.d.d = (Data *)0x0;
            local_78.d.ptr = L"(struct|class|namespace) +([A-Za-z0-9_]*)? +([A-Za-z0-9]*;?)";
            local_78.d.size = 0x3c;
            QRegularExpression::QRegularExpression
                      ((QRegularExpression *)&local_108,&local_78,(PatternOptions)0x0);
            if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
              }
            }
            local_128.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            bVar5 = false;
            qVar17 = 0;
            QRegularExpression::globalMatch
                      ((QRegularExpression *)&local_128,(QString *)&local_108,
                       (qsizetype)(local_d8 + 0x10),NormalMatch,(MatchOptions)0x0);
            do {
              bVar10 = QRegularExpressionMatchIterator::hasNext
                                 ((QRegularExpressionMatchIterator *)&local_128);
              if ((!bVar10) || (bVar5)) break;
              local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              QRegularExpressionMatchIterator::next((QRegularExpressionMatchIterator *)local_d8);
              local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              QRegularExpressionMatch::captured(&local_78,(QRegularExpressionMatch *)local_d8,2);
              bVar10 = QString::endsWith(&local_78,(QChar)0x3b,CaseSensitive);
              if (bVar10) {
LAB_00109155:
                bVar11 = QRegularExpressionMatch::hasCaptured((QRegularExpressionMatch *)local_d8,3)
                ;
                bVar10 = true;
                if (bVar11) {
                  QRegularExpressionMatch::captured(&local_58,(QRegularExpressionMatch *)local_d8,3)
                  ;
                  qVar19 = local_58.d.size;
                  pDVar8 = local_58.d.d;
                  pcVar7 = local_78.d.ptr;
                  pDVar6 = local_78.d.d;
                  local_58.d.d = local_78.d.d;
                  local_78.d.d = pDVar8;
                  local_78.d.ptr = local_58.d.ptr;
                  local_58.d.ptr = pcVar7;
                  local_58.d.size = local_78.d.size;
                  local_78.d.size = qVar19;
                  if (&pDVar6->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
                    ;
                    UNLOCK();
                    if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
                    {
                      QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
                    }
                  }
                  bVar11 = QString::endsWith(&local_78,(QChar)0x3b,CaseSensitive);
                  if (!bVar11) {
                    pQVar18 = QList<QString>::data((QList<QString> *)&local_98);
                    psVar4 = (storage_type_conflict *)pQVar18[lVar22].d.size;
                    if (((storage_type_conflict *)local_78.d.size == psVar4) &&
                       (lhs_00.m_size = (qsizetype)pQVar18[lVar22].d.ptr,
                       lhs_00.m_data = (storage_type_conflict *)local_78.d.size,
                       rhs_00.m_size = qVar17, rhs_00.m_data = psVar4,
                       bVar11 = QtPrivate::equalStrings((QtPrivate *)local_78.d.ptr,lhs_00,rhs_00),
                       bVar11)) {
                      iVar21 = 3;
                      qVar19 = QRegularExpressionMatch::capturedStart
                                         ((QRegularExpressionMatch *)local_d8,3);
                      if ((int)local_170 < qVar19) goto LAB_00109254;
                    }
                  }
                }
              }
              else {
                pQVar18 = QList<QString>::data((QList<QString> *)&local_98);
                psVar4 = (storage_type_conflict *)pQVar18[lVar22].d.size;
                if (((storage_type_conflict *)local_78.d.size != psVar4) ||
                   (lhs.m_size = (qsizetype)pQVar18[lVar22].d.ptr,
                   lhs.m_data = (storage_type_conflict *)local_78.d.size, rhs.m_size = qVar17,
                   rhs.m_data = psVar4,
                   bVar10 = QtPrivate::equalStrings((QtPrivate *)local_78.d.ptr,lhs,rhs), !bVar10))
                goto LAB_00109155;
                iVar21 = 2;
                qVar19 = QRegularExpressionMatch::capturedStart
                                   ((QRegularExpressionMatch *)local_d8,2);
                if (qVar19 <= (int)local_170) goto LAB_00109155;
LAB_00109254:
                local_170 = QRegularExpressionMatch::capturedStart
                                      ((QRegularExpressionMatch *)local_d8,iVar21);
                bVar5 = true;
                bVar10 = false;
              }
              if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
                }
              }
              QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)local_d8)
              ;
            } while (bVar10);
            QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
                      ((QRegularExpressionMatchIterator *)&local_128);
            QRegularExpression::~QRegularExpression((QRegularExpression *)&local_108);
            if (!bVar5) {
              bVar9 = false;
              break;
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < (long)(local_98.size + -1));
          lVar22 = (long)(int)local_170;
        }
        if (bVar9) {
          local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_78.d.d = (Data *)0x0;
          local_78.d.ptr = L"enum +([A-Za-z0-9_]*)";
          local_78.d.size = 0x15;
          QRegularExpression::QRegularExpression
                    ((QRegularExpression *)local_d8,&local_78,(PatternOptions)0x0);
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
            }
          }
          local_e0.d.d.ptr =
               (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)&DAT_aaaaaaaaaaaaaaaa;
          qVar17 = 0;
          QRegularExpression::globalMatch
                    (&local_e0,(QString *)local_d8,(qsizetype)(local_d8 + 0x10),NormalMatch,
                     (MatchOptions)0x0);
          do {
            bVar9 = QRegularExpressionMatchIterator::hasNext
                              ((QRegularExpressionMatchIterator *)&local_e0);
            iVar21 = 0;
            if (!bVar9) break;
            local_e8.d.d.ptr =
                 (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa
            ;
            QRegularExpressionMatchIterator::next((QRegularExpressionMatchIterator *)&local_e8);
            qVar19 = QRegularExpressionMatch::capturedStart(&local_e8,0);
            iVar21 = 0xb;
            if (lVar22 <= qVar19) {
              local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              QRegularExpressionMatch::captured(&local_78,&local_e8,1);
              iVar21 = 0;
              if (((storage_type_conflict *)local_78.d.size == psVar3) &&
                 (lhs_01.m_size = (qsizetype)pcVar2,
                 lhs_01.m_data = (storage_type_conflict *)local_78.d.size, rhs_01.m_size = qVar17,
                 rhs_01.m_data = psVar3,
                 bVar9 = QtPrivate::equalStrings((QtPrivate *)local_78.d.ptr,lhs_01,rhs_01), bVar9))
              {
                qVar17 = QRegularExpressionMatch::capturedEnd(&local_e8,0);
                local_58.d.d = (Data *)pQStack_c0;
                local_58.d.ptr = local_b8;
                qVar17 = QStringView::indexOf
                                   ((QStringView *)&local_58,(QChar)0x7b,qVar17,CaseSensitive);
                uVar14 = (uint)qVar17;
                local_58.d.d = (Data *)pQStack_c0;
                local_58.d.ptr = local_b8;
                qVar17 = QStringView::indexOf
                                   ((QStringView *)&local_58,(QChar)0x7d,(long)(int)uVar14,
                                    CaseSensitive);
                local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                QString::mid(&local_58,(QString *)(local_d8 + 0x10),(long)(int)(uVar14 + 1),
                             (long)(int)((int)qVar17 + ~uVar14));
                local_108.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_108.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
                qVar17 = 1;
                QString::split((QStringList *)&local_108,&local_58,(QChar)0xa,(SplitBehavior)0x0,
                               CaseSensitive);
                if ((undefined1 *)local_108.size != (undefined1 *)0x0) {
                  lVar20 = local_108.size * 0x18;
                  pQVar16 = local_108.ptr;
                  do {
                    local_128.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                    local_128.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                    local_128.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                    QString::trimmed_helper(&local_128,pQVar16);
                    if (((undefined1 *)local_128.d.size != (undefined1 *)0x0) &&
                       (bVar12 = QString::startsWith(&local_128,(QChar)0x23,CaseSensitive), !bVar12)
                       ) {
                      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                                ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                                 (__return_storage_ptr__->d).size,&local_128);
                      QList<QString>::end(__return_storage_ptr__);
                    }
                    if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_128.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    pQVar16 = pQVar16 + 1;
                    lVar20 = lVar20 + -0x18;
                  } while (lVar20 != 0);
                }
                QArrayDataPointer<QString>::~QArrayDataPointer(&local_108);
                if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
                  }
                }
                bVar12 = true;
                iVar21 = 1;
              }
              if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            QRegularExpressionMatch::~QRegularExpressionMatch(&local_e8);
          } while ((iVar21 == 0xb) || (iVar21 == 0));
          QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
                    ((QRegularExpressionMatchIterator *)&local_e0);
          QRegularExpression::~QRegularExpression((QRegularExpression *)local_d8);
          bVar9 = bVar12;
        }
        else {
          iVar21 = 0;
          bVar9 = bVar12;
        }
        QTextStream::~QTextStream((QTextStream *)(local_d8 + 8));
        if ((QArrayData *)local_d8._16_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_d8._16_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_d8._16_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_d8._16_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_d8._16_8_,2,0x10);
          }
        }
      }
      QFile::~QFile((QFile *)&local_a8);
      if (iVar21 != 0) goto LAB_001096fb;
      name_00 = name_00 + 1;
      bVar12 = bVar9;
    } while (name_00 != pQVar1);
    iVar21 = 2;
LAB_001096fb:
    if (iVar21 != 2 && !bVar9) {
      QArrayDataPointer<QString>::~QArrayDataPointer(&__return_storage_ptr__->d);
    }
  }
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList Parser::findEnumValues(const QString &name, const QStringList &includes)
{
    QStringList split = name.split(QStringLiteral("::"));
    QString enumName = split.last();
    DEBUGPRINTF(printf("searching for %s\n", qPrintable(name)));
    QStringList ret;
    for (const QString &filename : includes) {
        QFile input(filename);
        if (!input.open(QIODevice::ReadOnly | QIODevice::Text)) {
            DEBUGPRINTF(printf("Cannot open '%s' for reading: %s\n",
                                qPrintable(filename), qPrintable(input.errorString())));
            return ret;
        }
        QString data;
        QTextStream stream(&input);
        while (!stream.atEnd()) {
            QString line = stream.readLine().trimmed();
            data += line + QLatin1Char('\n');
        }
        simplifyData(data);

        int pos = 0;
        bool valid = true;
        for (int i = 0; i < split.size() - 1; i++) {
            QRegularExpression macro(QStringLiteral("(struct|class|namespace) +([A-Za-z0-9_]*)? +([A-Za-z0-9]*;?)"));
            QRegularExpressionMatchIterator m = macro.globalMatch(data);
            bool found = false;
            while (m.hasNext() && !found) {
                QRegularExpressionMatch match = m.next();
                QString n = match.captured(2);
                if (!n.endsWith(QLatin1Char(';')) && n == split[i] && match.capturedStart(2) > pos) {
                    pos = match.capturedStart(2);
                    found = true;
                    break;
                }
                if (match.hasCaptured(3)) {
                    n = match.captured(3);
                    if (!n.endsWith(QLatin1Char(';')) && n == split[i] && match.capturedStart(3) > pos) {
                        pos = match.capturedStart(3);
                        found = true;
                        break;
                    }
                }
            }
            if (!found) {
                valid = false;
                break;
            }
        }

        if (valid) {
            QRegularExpression macro(QStringLiteral("enum +([A-Za-z0-9_]*)"));
            QRegularExpressionMatchIterator m = macro.globalMatch(data);
            while (m.hasNext()) {
                QRegularExpressionMatch match = m.next();

                if (match.capturedStart() < pos)
                    continue;

                QString n = match.captured(1);

                if (n == enumName) {
                    DEBUGPRINTF(printf("Found enum: %s\n", qPrintable(n)));
                    int begin = data.indexOf(QLatin1Char('{'), match.capturedEnd());
                    int end = data.indexOf(QLatin1Char('}'), begin);
                    QString block = data.mid(begin + 1, end - begin - 1);
                    const QStringList enums = block.split(QLatin1Char('\n'));
                    for (const auto &e : enums) {
                        const auto trimmed = e.trimmed();
                        if (!trimmed.isEmpty() && !trimmed.startsWith(QLatin1Char('#')))
                            ret << trimmed;
                    }

                    return ret;
                }
            }
        }
    }
    return ret;
}